

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *p)

{
  bmcg_sat_solver *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int ValB_2;
  int ValA_2;
  int ValB_1;
  int ValA_1;
  int ValB;
  int ValA;
  int nFanins;
  int nLazy;
  int Node [2];
  int Entry [2];
  int j;
  int k;
  int i;
  Zyx_Man_t *p_local;
  
  ValA = 0;
  for (j = p->pPars->nVars; j < p->nObjs; j = j + 1) {
    iVar2 = Zyx_ManCollectFanins(p,j);
    if (iVar2 != p->pPars->nLutSize) {
      ValA = ValA + 1;
      if (iVar2 != p->nLits[1]) {
        __assert_fail("nFanins == p->nLits[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x364,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      if (p->pPars->nLutSize < p->nLits[1]) {
        p->nLits[1] = p->pPars->nLutSize + 1;
        iVar2 = bmcg_sat_solver_addclause(p->pSat,p->pLits[1],p->nLits[1]);
        if (iVar2 == 0) {
          return -1;
        }
      }
      else {
        iVar2 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
        if (iVar2 == 0) {
          return -1;
        }
      }
    }
  }
  if ((ValA != 0) || (p->pPars->fOrderNodes == 0)) {
    return ValA;
  }
  j = p->pPars->nVars;
LAB_0071344f:
  do {
    iVar2 = j;
    j = iVar2 + 1;
    if (p->nObjs <= j) {
      Entry[1] = 0;
      do {
        iVar2 = Vec_IntSize(p->vPairs);
        if (iVar2 <= Entry[1] + 1) {
          return ValA;
        }
        Node[0] = Vec_IntEntry(p->vPairs,Entry[1]);
        Node[1] = Vec_IntEntry(p->vPairs,Entry[1] + 1);
        if (Node[1] <= Node[0]) {
          __assert_fail("Entry[0] < Entry[1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                        ,0x3b8,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
        }
        for (Entry[0] = 0; Entry[0] < 2; Entry[0] = Entry[0] + 1) {
          (&nFanins)[Entry[0]] = -1;
          for (j = p->pPars->nVars; j < p->nObjs; j = j + 1) {
            pbVar1 = p->pSat;
            iVar2 = Zyx_TopoVar(p,j,Node[Entry[0]]);
            iVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar2);
            if (iVar2 != 0) {
              (&nFanins)[Entry[0]] = j;
              break;
            }
          }
          if ((&nFanins)[Entry[0]] < p->pPars->nVars) {
            __assert_fail("Node[j] >= p->pPars->nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3c2,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
        }
        if (nLazy < nFanins) {
          if (nFanins <= nLazy) {
            __assert_fail("Node[0] > Node[1]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3c7,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          ValA = ValA + 1;
          pbVar1 = p->pSat;
          iVar2 = Zyx_TopoVar(p,nLazy,Node[0]);
          iVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar2);
          if (iVar2 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3ca,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          pbVar1 = p->pSat;
          iVar2 = Zyx_TopoVar(p,nLazy,Node[1]);
          iVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar2);
          if (iVar2 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x3cb,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          p->nLits[0] = 0;
          for (Entry[0] = p->pPars->nVars; Entry[0] <= nLazy; Entry[0] = Entry[0] + 1) {
            pbVar1 = p->pSat;
            iVar2 = Zyx_TopoVar(p,Entry[0],Node[0]);
            iVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar2);
            pbVar1 = p->pSat;
            iVar3 = Zyx_TopoVar(p,Entry[0],Node[1]);
            iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
            iVar4 = Zyx_TopoVar(p,Entry[0],Node[0]);
            iVar4 = Abc_Var2Lit(iVar4,iVar2);
            iVar2 = p->nLits[0];
            p->nLits[0] = iVar2 + 1;
            p->pLits[0][iVar2] = iVar4;
            iVar2 = Zyx_TopoVar(p,Entry[0],Node[1]);
            iVar3 = Abc_Var2Lit(iVar2,iVar3);
            iVar2 = p->nLits[0];
            p->nLits[0] = iVar2 + 1;
            p->pLits[0][iVar2] = iVar3;
          }
          iVar2 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
          if (iVar2 == 0) {
            return -1;
          }
        }
        Entry[1] = Entry[1] + 2;
      } while( true );
    }
    Entry[1] = p->pPars->nLutSize;
    do {
      Entry[1] = Entry[1] + -1;
      if (Entry[1] < 0) break;
    } while (p->pFanins[iVar2][Entry[1]] == p->pFanins[j][Entry[1]]);
    if (Entry[1] == -1) {
      if (p->pPars->fMajority == 0) {
        for (Entry[1] = p->LutMask; -1 < Entry[1]; Entry[1] = Entry[1] + -1) {
          pbVar1 = p->pSat;
          iVar3 = Zyx_FuncVar(p,iVar2,Entry[1]);
          iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
          pbVar1 = p->pSat;
          iVar4 = Zyx_FuncVar(p,j,Entry[1]);
          iVar4 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar4);
          if (iVar3 != iVar4) break;
        }
        if (Entry[1] != -1) {
          pbVar1 = p->pSat;
          iVar3 = Zyx_FuncVar(p,iVar2,Entry[1]);
          iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
          if (iVar3 == 0) {
            pbVar1 = p->pSat;
            iVar3 = Zyx_FuncVar(p,j,Entry[1]);
            iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
            if (iVar3 == 1) goto LAB_0071344f;
          }
          ValA = ValA + 1;
          pbVar1 = p->pSat;
          iVar3 = Zyx_FuncVar(p,iVar2,Entry[1]);
          iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
          if (iVar3 != 1) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x38d,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          pbVar1 = p->pSat;
          iVar3 = Zyx_FuncVar(p,j,Entry[1]);
          iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
          if (iVar3 != 0) {
            __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i , k)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                          ,0x38e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
          }
          p->nLits[0] = 0;
          for (Entry[0] = p->LutMask; Entry[1] <= Entry[0]; Entry[0] = Entry[0] + -1) {
            pbVar1 = p->pSat;
            iVar3 = Zyx_FuncVar(p,iVar2,Entry[0]);
            iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
            pbVar1 = p->pSat;
            iVar4 = Zyx_FuncVar(p,j,Entry[0]);
            iVar4 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar4);
            iVar5 = Zyx_FuncVar(p,iVar2,Entry[0]);
            iVar5 = Abc_Var2Lit(iVar5,iVar3);
            iVar3 = p->nLits[0];
            p->nLits[0] = iVar3 + 1;
            p->pLits[0][iVar3] = iVar5;
            iVar3 = Zyx_FuncVar(p,j,Entry[0]);
            iVar4 = Abc_Var2Lit(iVar3,iVar4);
            iVar3 = p->nLits[0];
            p->nLits[0] = iVar3 + 1;
            p->pLits[0][iVar3] = iVar4;
          }
          iVar2 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
          if (iVar2 == 0) {
            return -1;
          }
        }
      }
      goto LAB_0071344f;
    }
    if (p->pFanins[iVar2][Entry[1]] < p->pFanins[j][Entry[1]]) {
      pbVar1 = p->pSat;
      iVar2 = Zyx_TopoVar(p,iVar2,p->pFanins[j][Entry[1]]);
      iVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar2);
      if (iVar2 != 0) {
        __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x39e,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      pbVar1 = p->pSat;
      iVar2 = Zyx_TopoVar(p,j,p->pFanins[j][Entry[1]]);
      iVar2 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar2);
      if (iVar2 != 1) {
        __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i][k])) == 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x39f,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
    }
    else {
      ValA = ValA + 1;
      pbVar1 = p->pSat;
      iVar3 = Zyx_TopoVar(p,iVar2,p->pFanins[iVar2][Entry[1]]);
      iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
      if (iVar3 != 1) {
        __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x3a3,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      pbVar1 = p->pSat;
      iVar3 = Zyx_TopoVar(p,j,p->pFanins[iVar2][Entry[1]]);
      iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
      if (iVar3 != 0) {
        __assert_fail("bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i , p->pFanins[i-1][k])) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                      ,0x3a4,"int Zyx_ManAddCnfLazyTopo(Zyx_Man_t *)");
      }
      p->nLits[0] = 0;
      for (Entry[0] = p->pFanins[iVar2][Entry[1]]; Entry[0] < p->nObjs + -1; Entry[0] = Entry[0] + 1
          ) {
        pbVar1 = p->pSat;
        iVar3 = Zyx_TopoVar(p,iVar2,Entry[0]);
        iVar3 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar3);
        pbVar1 = p->pSat;
        iVar4 = Zyx_TopoVar(p,j,Entry[0]);
        iVar4 = bmcg_sat_solver_read_cex_varvalue(pbVar1,iVar4);
        iVar5 = Zyx_TopoVar(p,iVar2,Entry[0]);
        iVar5 = Abc_Var2Lit(iVar5,iVar3);
        iVar3 = p->nLits[0];
        p->nLits[0] = iVar3 + 1;
        p->pLits[0][iVar3] = iVar5;
        iVar3 = Zyx_TopoVar(p,j,Entry[0]);
        iVar4 = Abc_Var2Lit(iVar3,iVar4);
        iVar3 = p->nLits[0];
        p->nLits[0] = iVar3 + 1;
        p->pLits[0][iVar3] = iVar4;
      }
      iVar2 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
      if (iVar2 == 0) {
        return -1;
      }
    }
  } while( true );
}

Assistant:

int Zyx_ManAddCnfLazyTopo( Zyx_Man_t * p )
{
    int i, k, j, Entry[2], Node[2], nLazy = 0;
    // fanin count
    //printf( "Adding topology clauses.\n" );
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        if ( nFanins == p->pPars->nLutSize )
            continue;
        nLazy++;
        assert( nFanins == p->nLits[1] );
        if ( p->nLits[1] > p->pPars->nLutSize )
        {
            p->nLits[1] = p->pPars->nLutSize + 1;
            //Zyx_PrintClause( p->pLits[1], p->nLits[1] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[1], p->nLits[1] ) )
                return -1;
        }
        else // if ( p->nLits[1] < p->pPars->nLutSize )
        {
            //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
        }
    }
    if ( nLazy || !p->pPars->fOrderNodes )
        return nLazy;
    // ordering
    for ( i = p->pPars->nVars + 1; i < p->nObjs; i++ )
    {
        for ( k = p->pPars->nLutSize - 1; k >= 0; k-- )
            if ( p->pFanins[i-1][k] != p->pFanins[i][k] )
                break;
        if ( k == -1 ) // fanins are equal
        {
            if ( p->pPars->fMajority )
                continue;
            // compare by LUT functions
            for ( k = p->LutMask; k >= 0; k-- )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) != 
                     bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) )
                    break;
            if ( k == -1 ) // truth tables cannot be equal
                continue;
            // rule out these truth tables
            if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 0 && 
                 bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 1 )
            {
                continue;
            }
            nLazy++;
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, k)) == 1 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i  , k)) == 0 );
            // rule out this order
            p->nLits[0] = 0;
            for ( j = p->LutMask; j >= k; j-- )
            {
                int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i-1, j));
                int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_FuncVar(p, i,   j));
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i-1, j), ValA );
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_FuncVar(p, i,   j), ValB );
            }
            if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                return -1;
            continue;
        }
        if ( p->pFanins[i-1][k] < p->pFanins[i][k] )
        {
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i][k])) == 0 );
            assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i][k])) == 1 );
            continue;
        }
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, p->pFanins[i-1][k])) == 1 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i  , p->pFanins[i-1][k])) == 0 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pFanins[i-1][k]; j < p->nObjs-1; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i-1, j));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i,   j));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i-1, j), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, i,   j), ValB );
        }
        //printf( "\n" );
        //Zyx_ManPrintVarMap( p, 1 );
        //Zyx_PrintClause( p->pLits[0], p->nLits[0] );
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
        //break;
    }
    // check symmetric variables
    Vec_IntForEachEntryDouble( p->vPairs, Entry[0], Entry[1], k )
    {
        assert( Entry[0] < Entry[1] );
        for ( j = 0; j < 2; j++ )
        {
            Node[j] = -1;
            for ( i = p->pPars->nVars; i < p->nObjs; i++ )
                if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, i, Entry[j])) )
                {
                    Node[j] = i;
                    break;
                }
            assert( Node[j] >= p->pPars->nVars );
        }
        // compare the nodes
        if ( Node[0] <= Node[1] )
            continue;
        assert( Node[0] > Node[1] );
        // create blocking clause
        nLazy++;
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[0])) == 0 );
        assert( bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, Node[1], Entry[1])) == 1 );
        // rule out this order
        p->nLits[0] = 0;
        for ( j = p->pPars->nVars; j <= Node[1]; j++ )
        {
            int ValA = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[0]));
            int ValB = bmcg_sat_solver_read_cex_varvalue(p->pSat, Zyx_TopoVar(p, j, Entry[1]));
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[0]), ValA );
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(Zyx_TopoVar(p, j, Entry[1]), ValB );
        }
        if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
            return -1;
    }
    return nLazy;
}